

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::CaseGenerateSyntax::setChild
          (CaseGenerateSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0045297c + *(int *)(&DAT_0045297c + index * 4)))();
  return;
}

Assistant:

void CaseGenerateSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: openParen = child.token(); return;
        case 3: condition = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: closeParen = child.token(); return;
        case 5: items = child.node()->as<SyntaxList<CaseItemSyntax>>(); return;
        case 6: endCase = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}